

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall
argparse::ArgumentParser::ArgumentParser
          (ArgumentParser *this,string *program_name,string *version,default_arguments add_args,
          bool exit_on_default_arguments,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  Argument *pAVar5;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__storage_1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__storage;
  anon_class_1_0_00000001 local_f1;
  ostream *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  any local_90;
  any local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = &(this->m_program_name).field_2;
  (this->m_program_name)._M_dataplus._M_p = (pointer)local_b8;
  pcVar3 = (program_name->_M_dataplus)._M_p;
  paVar1 = &program_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&program_name->field_2 + 8);
    local_b8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_program_name).field_2 + 8) = uVar4;
  }
  else {
    (this->m_program_name)._M_dataplus._M_p = pcVar3;
    (this->m_program_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->m_program_name)._M_string_length = program_name->_M_string_length;
  (program_name->_M_dataplus)._M_p = (pointer)paVar1;
  program_name->_M_string_length = 0;
  (program_name->field_2)._M_local_buf[0] = '\0';
  local_c0 = &(this->m_version).field_2;
  (this->m_version)._M_dataplus._M_p = (pointer)local_c0;
  pcVar3 = (version->_M_dataplus)._M_p;
  paVar1 = &version->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&version->field_2 + 8);
    local_c0->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_version).field_2 + 8) = uVar4;
  }
  else {
    (this->m_version)._M_dataplus._M_p = pcVar3;
    (this->m_version).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->m_version)._M_string_length = version->_M_string_length;
  (version->_M_dataplus)._M_p = (pointer)paVar1;
  version->_M_string_length = 0;
  (version->field_2)._M_local_buf[0] = '\0';
  local_c8 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)local_c8;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->m_epilog).field_2;
  (this->m_epilog)._M_dataplus._M_p = (pointer)local_d0;
  (this->m_epilog)._M_string_length = 0;
  (this->m_epilog).field_2._M_local_buf[0] = '\0';
  this->m_exit_on_default_arguments = exit_on_default_arguments;
  local_d8 = &(this->m_prefix_chars).field_2;
  (this->m_prefix_chars)._M_dataplus._M_p = (pointer)local_d8;
  local_f0 = os;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_prefix_chars,"-","");
  local_e0 = &(this->m_assign_chars).field_2;
  (this->m_assign_chars)._M_dataplus._M_p = (pointer)local_e0;
  local_98 = &this->m_prefix_chars;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_assign_chars,"=","");
  this->m_is_parsed = false;
  (this->m_positional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_positional_arguments;
  (this->m_positional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_positional_arguments;
  (this->m_positional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->m_optional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_optional_arguments;
  (this->m_optional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_optional_arguments;
  (this->m_optional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  p_Var2 = &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = &this->m_parser_path;
  local_e8 = &(this->m_parser_path).field_2;
  (this->m_parser_path)._M_dataplus._M_p = (pointer)local_e8;
  pcVar3 = (this->m_program_name)._M_dataplus._M_p;
  local_a0 = &this->m_assign_chars;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar3,pcVar3 + (this->m_program_name)._M_string_length);
  (this->m_subparsers).
  super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_subparsers;
  (this->m_subparsers).
  super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_subparsers;
  (this->m_subparsers).
  super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var2 = &(this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_mutually_exclusive_groups).
  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mutually_exclusive_groups).
  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mutually_exclusive_groups).
  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_suppress = false;
  if ((add_args & help) != none) {
    pAVar5 = add_argument<char_const*,char_const*>(this,"-h","--help");
    local_b0 = &pAVar5->m_action;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_&>
      ::_S_vtable._M_arr
      [(pAVar5->m_action).
       super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
       .
       super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       ._M_index]._M_data)(&local_f1,local_b0);
    *(ArgumentParser **)
     &(pAVar5->m_action).
      super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      ._M_u = this;
    *(ostream **)
     ((long)&(pAVar5->m_action).
             super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             .
             super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             ._M_u + 8) = local_f0;
    *(code **)((long)&(pAVar5->m_action).
                      super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      .
                      super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      ._M_u + 0x18) =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/WEYTEC[P]LMSS/src/argparse.hpp:1450:19)>
         ::_M_invoke;
    *(code **)((long)&(pAVar5->m_action).
                      super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      .
                      super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      ._M_u + 0x10) =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/WEYTEC[P]LMSS/src/argparse.hpp:1450:19)>
         ::_M_manager;
    (pAVar5->m_action).
    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    ._M_index = '\x01';
    std::
    get<1ul,std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
              (local_b0);
    local_f1 = (anon_class_1_0_00000001)0x0;
    pAVar5 = Argument::default_value<bool>(pAVar5,(bool *)&local_f1);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"shows help message and exits","");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pAVar5->m_help,&local_70);
    local_90._M_manager = std::any::_Manager_internal<bool>::_S_manage;
    local_90._M_storage = (_Storage)0x1;
    std::any::operator=(&pAVar5->m_implicit_value,&local_90);
    (pAVar5->m_num_args_range).m_min = 0;
    (pAVar5->m_num_args_range).m_max = 0;
    if (local_90._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_90._M_manager)(_Op_destroy,&local_90,(_Arg *)0x0);
      local_90._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((add_args & version) != none) {
    pAVar5 = add_argument<char_const*,char_const*>(this,"-v","--version");
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_&>
      ::_S_vtable._M_arr
      [(pAVar5->m_action).
       super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
       .
       super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       .
       super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
       ._M_index]._M_data)(&local_f1,&pAVar5->m_action);
    *(ArgumentParser **)
     &(pAVar5->m_action).
      super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      .
      super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      ._M_u = this;
    *(ostream **)
     ((long)&(pAVar5->m_action).
             super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             .
             super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             .
             super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
             ._M_u + 8) = local_f0;
    *(code **)((long)&(pAVar5->m_action).
                      super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      .
                      super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      ._M_u + 0x18) =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/WEYTEC[P]LMSS/src/argparse.hpp:1463:19)>
         ::_M_invoke;
    *(code **)((long)&(pAVar5->m_action).
                      super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      .
                      super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      .
                      super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                      ._M_u + 0x10) =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/WEYTEC[P]LMSS/src/argparse.hpp:1463:19)>
         ::_M_manager;
    (pAVar5->m_action).
    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    ._M_index = '\x01';
    std::
    get<1ul,std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
              (&pAVar5->m_action);
    local_f1 = (anon_class_1_0_00000001)0x0;
    pAVar5 = Argument::default_value<bool>(pAVar5,(bool *)&local_f1);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"prints version information and exits","");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pAVar5->m_help,&local_50);
    local_80._M_manager = std::any::_Manager_internal<bool>::_S_manage;
    local_80._M_storage = (_Storage)0x1;
    std::any::operator=(&pAVar5->m_implicit_value,&local_80);
    (pAVar5->m_num_args_range).m_min = 0;
    (pAVar5->m_num_args_range).m_max = 0;
    if (local_80._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_80._M_manager)(_Op_destroy,&local_80,(_Arg *)0x0);
      local_80._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string program_name = {},
                          std::string version = "1.0",
                          default_arguments add_args = default_arguments::all,
                          bool exit_on_default_arguments = true,
                          std::ostream &os = std::cout)
      : m_program_name(std::move(program_name)), m_version(std::move(version)),
        m_exit_on_default_arguments(exit_on_default_arguments),
        m_parser_path(m_program_name) {
    if ((add_args & default_arguments::help) == default_arguments::help) {
      add_argument("-h", "--help")
          .action([&](const auto & /*unused*/) {
            os << help().str();
            if (m_exit_on_default_arguments) {
              std::exit(0);
            }
          })
          .default_value(false)
          .help("shows help message and exits")
          .implicit_value(true)
          .nargs(0);
    }
    if ((add_args & default_arguments::version) == default_arguments::version) {
      add_argument("-v", "--version")
          .action([&](const auto & /*unused*/) {
            os << m_version << std::endl;
            if (m_exit_on_default_arguments) {
              std::exit(0);
            }
          })
          .default_value(false)
          .help("prints version information and exits")
          .implicit_value(true)
          .nargs(0);
    }
  }